

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# observer.hpp
# Opt level: O2

void __thiscall
baryonyx::details::pi_pnm_observer::pi_pnm_observer
          (pi_pnm_observer *this,string_view filename,int m,int param_3,long loop)

{
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
  aVar1;
  string_view format_str;
  basic_string_view<char> bVar2;
  format_args args;
  string sStack_58;
  char *local_38;
  size_t local_30;
  
  local_38 = filename._M_str;
  local_30 = filename._M_len;
  this->constraints = m;
  aVar1 = (anon_union_8_2_de49483c_for_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>_2
           )loop;
  bVar2 = ::fmt::v7::to_string_view<char,_0>("{}-pi.pnm");
  format_str.data_ = (char *)bVar2.size_;
  format_str.size_ = 0xd;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .field_1.args_ = aVar1.args_;
  args.
  super_basic_format_args<fmt::v7::basic_format_context<fmt::v7::detail::buffer_appender<char>,_char>_>
  .desc_ = (unsigned_long_long)&local_38;
  ::fmt::v7::detail::vformat_abi_cxx11_(&sStack_58,(detail *)bVar2.data_,format_str,args);
  pnm_vector::pnm_vector(&this->m_pnm,&sStack_58,this->constraints,loop);
  std::__cxx11::string::~string((string *)&sStack_58);
  return;
}

Assistant:

pi_pnm_observer(const std::string_view filename,
                    int m,
                    int /*n*/,
                    long int loop)
      : constraints(m)
      , m_pnm(fmt::format("{}-pi.pnm", filename), constraints, loop)
    {}